

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax
          (NetDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token netType,NetStrengthSyntax *strength,Token expansionHint,DataTypeSyntax *type,
          TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  DataTypeSyntax *pDVar4;
  DeclaratorSyntax *pDVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  iterator_base<slang::syntax::DeclaratorSyntax_*> local_40;
  
  uVar6 = netType._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,NetDeclaration,attributes);
  (this->netType).kind = (short)uVar6;
  (this->netType).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->netType).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->netType).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->netType).info = netType.info;
  this->strength = strength;
  (this->expansionHint).kind = expansionHint.kind;
  (this->expansionHint).field_0x2 = expansionHint._2_1_;
  (this->expansionHint).numFlags = (NumericTokenFlags)expansionHint.numFlags.raw;
  (this->expansionHint).rawLen = expansionHint.rawLen;
  (this->expansionHint).info = expansionHint.info;
  local_40.list = (ParentList *)type;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,(DataTypeSyntax **)&local_40);
  this->delay = delay;
  SVar2 = (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
       (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00473390;
  sVar1 = (declarators->elements).size_;
  (this->declarators).elements.data_ = (declarators->elements).data_;
  (this->declarators).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (this->strength != (NetStrengthSyntax *)0x0) {
    (this->strength->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  pDVar4 = not_null<slang::syntax::DataTypeSyntax_*>::get(&this->type);
  (pDVar4->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (this->delay != (TimingControlSyntax *)0x0) {
    (this->delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_40.index = 0;
  sVar1 = (this->declarators).elements.size_;
  local_40.list = &this->declarators;
  for (; (local_40.list != &this->declarators || (local_40.index != sVar1 + 1 >> 1));
      local_40.index = local_40.index + 1) {
    pDVar5 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::operator*(&local_40);
    (pDVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

NetDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token netType, NetStrengthSyntax* strength, Token expansionHint, DataTypeSyntax& type, TimingControlSyntax* delay, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::NetDeclaration, attributes), netType(netType), strength(strength), expansionHint(expansionHint), type(&type), delay(delay), declarators(declarators), semi(semi) {
        if (this->strength) this->strength->parent = this;
        this->type->parent = this;
        if (this->delay) this->delay->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }